

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMU_PUBLIC_ID_Unmarshal(TPMU_PUBLIC_ID *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  uint uVar4;
  
  if ((int)selector < 0x23) {
    if (selector == 1) {
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar3 = 0x9a;
      if (1 < iVar1) {
        UVar2 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar2;
        *buffer = *buffer + 2;
        TVar3 = 0x95;
        if (*(ushort *)target < 0x101) {
          TVar3 = 0x9a;
          uVar4 = (uint)*(ushort *)target;
          if ((int)uVar4 <= *size) {
            memcpy((void *)((long)&(target->ecc).x + 2),*buffer,(ulong)uVar4);
            *size = *size - uVar4;
            *buffer = *buffer + uVar4;
            TVar3 = 0;
          }
        }
      }
      return TVar3;
    }
    if (selector == 8) {
TPM2B_DIGEST_Unmarshal:
      iVar1 = *size;
      *size = iVar1 + -2;
      TVar3 = 0x9a;
      if (1 < iVar1) {
        UVar2 = ByteArrayToUint16(*buffer);
        *(UINT16 *)target = UVar2;
        *buffer = *buffer + 2;
        TVar3 = 0x95;
        if (*(ushort *)target < 0x41) {
          TVar3 = 0x9a;
          uVar4 = (uint)*(ushort *)target;
          if ((int)uVar4 <= *size) {
            memcpy((void *)((long)&(target->ecc).x + 2),*buffer,(ulong)uVar4);
            *size = *size - uVar4;
            *buffer = *buffer + uVar4;
            TVar3 = 0;
          }
        }
      }
      return TVar3;
    }
  }
  else {
    if (selector == 0x23) {
      TVar3 = TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)target,buffer,size);
      if (TVar3 != 0) {
        return TVar3;
      }
      TVar3 = TPM2B_ECC_PARAMETER_Unmarshal(&(target->ecc).y,buffer,size);
      return TVar3;
    }
    if (selector == 0x25) goto TPM2B_DIGEST_Unmarshal;
  }
  return 0x98;
}

Assistant:

TPM_RC
TPMU_PUBLIC_ID_Unmarshal(TPMU_PUBLIC_ID *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->keyedHash), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->sym), buffer, size);
#endif // ALG_SYMCIPHER
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPM2B_PUBLIC_KEY_RSA_Unmarshal((TPM2B_PUBLIC_KEY_RSA *)&(target->rsa), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPMS_ECC_POINT_Unmarshal((TPMS_ECC_POINT *)&(target->ecc), buffer, size);
#endif // ALG_ECC
    }
    return TPM_RC_SELECTOR;
}